

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O2

void __thiscall pbrt::StatsAccumulator::WritePixelImages(StatsAccumulator *this)

{
  pointer pIVar1;
  bool bVar2;
  size_t j;
  ulong uVar3;
  Tuple2<pbrt::Point2,_int> TVar4;
  Stats *pSVar5;
  int x;
  long lVar6;
  Image *pIVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  Float FVar11;
  string n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  ImageMetadata local_198;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pSVar5 = this->stats;
  std::operator+(&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 pixelStatsBaseName_abi_cxx11_,"-time.exr");
  local_198.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_198.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header;
  local_198.colorSpace.optionalValue =
       (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
       )0x0;
  local_198.colorSpace.set = false;
  local_198.colorSpace._9_7_ = 0;
  local_198.stringVectors._M_t._M_impl._0_8_ = 0;
  local_198.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_198.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_198.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_198.NDCFromWorld.optionalValue._52_8_ = 0;
  local_198.NDCFromWorld._60_8_ = 0;
  local_198.pixelBounds.optionalValue._0_8_ = 0;
  local_198.pixelBounds.optionalValue._8_8_ = 0;
  local_198._160_8_ = 0;
  local_198.fullResolution._4_8_ = 0;
  local_198.samplesPerPixel.optionalValue = (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
  local_198.samplesPerPixel.set = false;
  local_198.samplesPerPixel._5_3_ = 0;
  local_198.MSE.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  local_198.MSE.set = false;
  local_198.MSE._5_3_ = 0;
  local_198.cameraFromWorld.optionalValue._56_8_ = 0;
  local_198._72_8_ = 0;
  local_198.NDCFromWorld.optionalValue._4_8_ = 0;
  local_198.NDCFromWorld.optionalValue._12_8_ = 0;
  local_198.NDCFromWorld.optionalValue._20_8_ = 0;
  local_198.NDCFromWorld.optionalValue._28_8_ = 0;
  local_198.NDCFromWorld.optionalValue._36_8_ = 0;
  local_198.NDCFromWorld.optionalValue._44_8_ = 0;
  local_198.renderTimeSeconds.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
  local_198.renderTimeSeconds.set = false;
  local_198.renderTimeSeconds._5_3_ = 0;
  local_198.cameraFromWorld.optionalValue._0_8_ = 0;
  local_198.cameraFromWorld.optionalValue._8_8_ = 0;
  local_198.cameraFromWorld.optionalValue._16_8_ = 0;
  local_198.cameraFromWorld.optionalValue._24_8_ = 0;
  local_198.cameraFromWorld.optionalValue._32_8_ = 0;
  local_198.cameraFromWorld.optionalValue._40_8_ = 0;
  local_198.cameraFromWorld.optionalValue._48_8_ = 0;
  local_198.stringVectors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_198.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_198.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar2 = Image::Write(&pSVar5->pixelTime,&local_50,&local_198);
  if (!bVar2) {
    LogFatal<char_const(&)[57]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/stats.cpp"
               ,0x1c1,"Check failed: %s",
               (char (*) [57])"stats->pixelTime.Write(pixelStatsBaseName + \"-time.exr\")");
  }
  ImageMetadata::~ImageMetadata(&local_198);
  std::__cxx11::string::~string((string *)&local_50);
  uVar10 = 0;
  do {
    pSVar5 = this->stats;
    if ((ulong)(((long)(pSVar5->pixelCounterImages).
                       super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(pSVar5->pixelCounterImages).
                      super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x98) <= uVar10) {
      uVar10 = 0;
      do {
        if ((ulong)(((long)(pSVar5->pixelRatioImages).
                           super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(pSVar5->pixelRatioImages).
                          super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                          super__Vector_impl_data._M_start) / 0x98) <= uVar10) {
          return;
        }
        std::operator+(&local_1b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       pixelStatsBaseName_abi_cxx11_,"-");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_198,&local_1b8,
                       (this->stats->pixelRatioNames).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + uVar10);
        std::operator+(&n,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_198,".exr");
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_1b8);
        for (uVar3 = 0; uVar3 < n._M_string_length; uVar3 = uVar3 + 1) {
          if (n._M_dataplus._M_p[uVar3] == '/') {
            n._M_dataplus._M_p[uVar3] = '_';
          }
        }
        lVar9 = 0;
        pIVar1 = (this->stats->pixelRatioImages).
                 super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                 super__Vector_impl_data._M_start;
        TVar4 = pIVar1[uVar10].resolution.super_Tuple2<pbrt::Point2,_int>;
        pIVar7 = pIVar1 + uVar10;
        for (lVar8 = 0; lVar8 < (long)TVar4 >> 0x20; lVar8 = lVar8 + 1) {
          lVar6 = 0;
          while (TVar4 = (pIVar7->resolution).super_Tuple2<pbrt::Point2,_int>, lVar6 < TVar4.x) {
            WrapMode2D::WrapMode2D((WrapMode2D *)&local_1b8,Clamp);
            Image::GetChannels((ImageChannelValues *)&local_198,pIVar7,(Point2i)(lVar9 + lVar6),
                               (WrapMode2D)local_1b8._M_dataplus._M_p);
            FVar11 = ImageChannelValues::MaxValue((ImageChannelValues *)&local_198);
            InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::~InlinedVector
                      ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                       &local_198);
            lVar6 = lVar6 + 1;
            if ((FVar11 != 0.0) || (NAN(FVar11))) {
              pIVar1 = (this->stats->pixelRatioImages).
                       super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                       super__Vector_impl_data._M_start;
              std::__cxx11::string::string((string *)&local_90,(string *)&n);
              local_198.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
                   &local_198.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header;
              local_198.colorSpace.optionalValue =
                   (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                    )0x0;
              local_198.colorSpace.set = false;
              local_198.colorSpace._9_7_ = 0;
              local_198.stringVectors._M_t._M_impl._0_8_ = 0;
              local_198.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
              ;
              local_198.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
              local_198.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)0x0;
              local_198.NDCFromWorld.optionalValue._52_8_ = 0;
              local_198.NDCFromWorld._60_8_ = 0;
              local_198.pixelBounds.optionalValue._0_8_ = 0;
              local_198.pixelBounds.optionalValue._8_8_ = 0;
              local_198._160_8_ = 0;
              local_198.fullResolution._4_8_ = 0;
              local_198.samplesPerPixel.optionalValue =
                   (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
              local_198.samplesPerPixel.set = false;
              local_198.samplesPerPixel._5_3_ = 0;
              local_198.MSE.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
              local_198.MSE.set = false;
              local_198.MSE._5_3_ = 0;
              local_198.cameraFromWorld.optionalValue._56_8_ = 0;
              local_198._72_8_ = 0;
              local_198.NDCFromWorld.optionalValue._4_8_ = 0;
              local_198.NDCFromWorld.optionalValue._12_8_ = 0;
              local_198.NDCFromWorld.optionalValue._20_8_ = 0;
              local_198.NDCFromWorld.optionalValue._28_8_ = 0;
              local_198.NDCFromWorld.optionalValue._36_8_ = 0;
              local_198.NDCFromWorld.optionalValue._44_8_ = 0;
              local_198.renderTimeSeconds.optionalValue =
                   (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
              local_198.renderTimeSeconds.set = false;
              local_198.renderTimeSeconds._5_3_ = 0;
              local_198.cameraFromWorld.optionalValue._0_8_ = 0;
              local_198.cameraFromWorld.optionalValue._8_8_ = 0;
              local_198.cameraFromWorld.optionalValue._16_8_ = 0;
              local_198.cameraFromWorld.optionalValue._24_8_ = 0;
              local_198.cameraFromWorld.optionalValue._32_8_ = 0;
              local_198.cameraFromWorld.optionalValue._40_8_ = 0;
              local_198.cameraFromWorld.optionalValue._48_8_ = 0;
              local_198.stringVectors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              local_198.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
                   local_198.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
              bVar2 = Image::Write(pIVar1 + uVar10,&local_90,&local_198);
              if (!bVar2) {
                LogFatal<char_const(&)[36]>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/stats.cpp"
                           ,0x1e2,"Check failed: %s",
                           (char (*) [36])"stats->pixelRatioImages[i].Write(n)");
              }
              ImageMetadata::~ImageMetadata(&local_198);
              std::__cxx11::string::~string((string *)&local_90);
              goto LAB_00489715;
            }
          }
          lVar9 = lVar9 + 0x100000000;
        }
LAB_00489715:
        std::__cxx11::string::~string((string *)&n);
        pSVar5 = this->stats;
        uVar10 = uVar10 + 1;
      } while( true );
    }
    std::operator+(&local_1b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   pixelStatsBaseName_abi_cxx11_,"-");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_198,
                   &local_1b8,
                   (this->stats->pixelCounterNames).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar10);
    std::operator+(&n,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &local_198,".exr");
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_1b8);
    for (uVar3 = 0; uVar3 < n._M_string_length; uVar3 = uVar3 + 1) {
      if (n._M_dataplus._M_p[uVar3] == '/') {
        n._M_dataplus._M_p[uVar3] = '_';
      }
    }
    lVar8 = 0;
    pIVar1 = (this->stats->pixelCounterImages).
             super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
             super__Vector_impl_data._M_start;
    TVar4 = pIVar1[uVar10].resolution.super_Tuple2<pbrt::Point2,_int>;
    pIVar7 = pIVar1 + uVar10;
    for (lVar9 = 0; lVar9 < (long)TVar4 >> 0x20; lVar9 = lVar9 + 1) {
      lVar6 = 0;
      while (TVar4 = (pIVar7->resolution).super_Tuple2<pbrt::Point2,_int>, lVar6 < TVar4.x) {
        WrapMode2D::WrapMode2D((WrapMode2D *)&local_198,Clamp);
        FVar11 = Image::GetChannel(pIVar7,(Point2i)(lVar8 + lVar6),0,
                                   (WrapMode2D)local_198.renderTimeSeconds);
        lVar6 = lVar6 + 1;
        if ((FVar11 != 0.0) || (NAN(FVar11))) {
          pIVar1 = (this->stats->pixelCounterImages).
                   super__Vector_base<pbrt::Image,_std::allocator<pbrt::Image>_>._M_impl.
                   super__Vector_impl_data._M_start;
          std::__cxx11::string::string((string *)&local_70,(string *)&n);
          local_198.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &local_198.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header;
          local_198.colorSpace.optionalValue =
               (aligned_storage_t<sizeof(const_pbrt::RGBColorSpace_*),_alignof(const_pbrt::RGBColorSpace_*)>
                )0x0;
          local_198.colorSpace.set = false;
          local_198.colorSpace._9_7_ = 0;
          local_198.stringVectors._M_t._M_impl._0_8_ = 0;
          local_198.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          local_198.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
          local_198.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          local_198.NDCFromWorld.optionalValue._52_8_ = 0;
          local_198.NDCFromWorld._60_8_ = 0;
          local_198.pixelBounds.optionalValue._0_8_ = 0;
          local_198.pixelBounds.optionalValue._8_8_ = 0;
          local_198._160_8_ = 0;
          local_198.fullResolution._4_8_ = 0;
          local_198.samplesPerPixel.optionalValue =
               (aligned_storage_t<sizeof(int),_alignof(int)>)0x0;
          local_198.samplesPerPixel.set = false;
          local_198.samplesPerPixel._5_3_ = 0;
          local_198.MSE.optionalValue = (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
          local_198.MSE.set = false;
          local_198.MSE._5_3_ = 0;
          local_198.cameraFromWorld.optionalValue._56_8_ = 0;
          local_198._72_8_ = 0;
          local_198.NDCFromWorld.optionalValue._4_8_ = 0;
          local_198.NDCFromWorld.optionalValue._12_8_ = 0;
          local_198.NDCFromWorld.optionalValue._20_8_ = 0;
          local_198.NDCFromWorld.optionalValue._28_8_ = 0;
          local_198.NDCFromWorld.optionalValue._36_8_ = 0;
          local_198.NDCFromWorld.optionalValue._44_8_ = 0;
          local_198.renderTimeSeconds.optionalValue =
               (aligned_storage_t<sizeof(float),_alignof(float)>)0x0;
          local_198.renderTimeSeconds.set = false;
          local_198.renderTimeSeconds._5_3_ = 0;
          local_198.cameraFromWorld.optionalValue._0_8_ = 0;
          local_198.cameraFromWorld.optionalValue._8_8_ = 0;
          local_198.cameraFromWorld.optionalValue._16_8_ = 0;
          local_198.cameraFromWorld.optionalValue._24_8_ = 0;
          local_198.cameraFromWorld.optionalValue._32_8_ = 0;
          local_198.cameraFromWorld.optionalValue._40_8_ = 0;
          local_198.cameraFromWorld.optionalValue._48_8_ = 0;
          local_198.stringVectors._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          local_198.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               local_198.stringVectors._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          bVar2 = Image::Write(pIVar1 + uVar10,&local_70,&local_198);
          if (!bVar2) {
            LogFatal<char_const(&)[38]>
                      (Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/stats.cpp"
                       ,0x1d1,"Check failed: %s",
                       (char (*) [38])"stats->pixelCounterImages[i].Write(n)");
          }
          ImageMetadata::~ImageMetadata(&local_198);
          std::__cxx11::string::~string((string *)&local_70);
          goto LAB_004894f6;
        }
      }
      lVar8 = lVar8 + 0x100000000;
    }
LAB_004894f6:
    std::__cxx11::string::~string((string *)&n);
    uVar10 = uVar10 + 1;
  } while( true );
}

Assistant:

void StatsAccumulator::WritePixelImages() const {
    // FIXME: do this where?
    CHECK(stats->pixelTime.Write(pixelStatsBaseName + "-time.exr"));

    for (size_t i = 0; i < stats->pixelCounterImages.size(); ++i) {
        std::string n = pixelStatsBaseName + "-" + stats->pixelCounterNames[i] + ".exr";
        for (size_t j = 0; j < n.size(); ++j)
            if (n[j] == '/')
                n[j] = '_';

        auto AllZero = [](const Image &im) {
            for (int y = 0; y < im.Resolution().y; ++y)
                for (int x = 0; x < im.Resolution().x; ++x)
                    if (im.GetChannel({x, y}, 0) != 0)
                        return false;
            return true;
        };
        if (!AllZero(stats->pixelCounterImages[i]))
            CHECK(stats->pixelCounterImages[i].Write(n));
    }

    for (size_t i = 0; i < stats->pixelRatioImages.size(); ++i) {
        std::string n = pixelStatsBaseName + "-" + stats->pixelRatioNames[i] + ".exr";
        for (size_t j = 0; j < n.size(); ++j)
            if (n[j] == '/')
                n[j] = '_';

        auto AllZero = [](const Image &im) {
            for (int y = 0; y < im.Resolution().y; ++y)
                for (int x = 0; x < im.Resolution().x; ++x)
                    if (im.GetChannels({x, y}).MaxValue() != 0)
                        return false;
            return true;
        };
        if (!AllZero(stats->pixelRatioImages[i]))
            CHECK(stats->pixelRatioImages[i].Write(n));
    }
}